

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *this_00;
  string_view str;
  string_view v;
  string_view str_00;
  Metadata MVar3;
  LogMessage LStack_48;
  string local_38;
  
  bVar2 = MessageLite::IsInitialized(&this->super_MessageLite);
  if (!bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x92,"IsInitialized()");
    str._M_str = "Message of type \"";
    str._M_len = 0x11;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_48,str)
    ;
    MVar3 = GetMetadata(this);
    pcVar1 = ((MVar3.descriptor)->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v._M_str = pcVar1 + ~v._M_len;
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,v);
    str_00._M_str = "\" is missing required fields: ";
    str_00._M_len = 0x1e;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_00)
    ;
    InitializationErrorString_abi_cxx11_(&local_38,this);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,&local_38);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_48);
    }
  }
  return;
}

Assistant:

void Message::CheckInitialized() const {
  ABSL_CHECK(IsInitialized())
      << "Message of type \"" << GetDescriptor()->full_name()
      << "\" is missing required fields: " << InitializationErrorString();
}